

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O1

string * __thiscall
gl3cts::ReservedNamesTest::getShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,ReservedNamesTest *this,_shader_type shader_type,
          _language_feature language_feature,char *invalid_name)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  TestError *this_00;
  long lVar4;
  char *pcVar5;
  stringstream body_sstream;
  stringstream asStack_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  uVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version ",9);
  uVar2 = uVar2 & 0x3ff;
  if (uVar2 < 0x124) {
    if (uVar2 < 0x114) {
      if (uVar2 == 0x104) {
        pcVar5 = "400";
      }
      else {
        if (uVar2 != 0x113) {
LAB_00a871f5:
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Unsupported GL context version - please implement",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                     ,0x1278);
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        pcVar5 = "140";
      }
    }
    else if (uVar2 == 0x114) {
      pcVar5 = "410";
    }
    else {
      if (uVar2 != 0x123) goto LAB_00a871f5;
      pcVar5 = "150";
    }
  }
  else if (uVar2 < 0x134) {
    if (uVar2 == 0x124) {
      pcVar5 = "420";
    }
    else {
      if (uVar2 != 0x133) goto LAB_00a871f5;
      pcVar5 = "330";
    }
  }
  else if (uVar2 == 0x134) {
    pcVar5 = "430";
  }
  else if (uVar2 == 0x144) {
    pcVar5 = "440";
  }
  else {
    if (uVar2 != 0x154) goto LAB_00a871f5;
    pcVar5 = "450";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n\n",2);
  if (shader_type == LANGUAGE_FEATURE_ATOMIC_COUNTER) {
    lVar4 = 0x41;
    pcVar5 = "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n";
LAB_00a86145:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,lVar4);
  }
  else {
    if (shader_type == LANGUAGE_FEATURE_FUNCTION_NAME) {
      lVar4 = 0x16;
      pcVar5 = "layout(triangles) in;\n";
      goto LAB_00a86145;
    }
    if (shader_type == LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME) {
      lVar4 = 0x1a;
      pcVar5 = "layout(vertices = 3) out;\n";
      goto LAB_00a86145;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n\n",2);
  iVar1 = (int)(ostream *)local_1a8;
  switch(language_feature) {
  case LANGUAGE_FEATURE_ATOMIC_COUNTER:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(binding = 0, offset = 0) uniform atomic_uint ",0x34);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    switch(language_feature) {
    case LANGUAGE_FEATURE_ATTRIBUTE:
      goto switchD_00a8617c_caseD_1;
    case LANGUAGE_FEATURE_CONSTANT:
      goto switchD_00a8617c_caseD_2;
    case LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME:
      goto switchD_00a8617c_caseD_3;
    case LANGUAGE_FEATURE_FUNCTION_NAME:
      goto switchD_00a8617c_caseD_4;
    case LANGUAGE_FEATURE_INPUT:
      goto switchD_00a8617c_caseD_5;
    case LANGUAGE_FEATURE_INPUT_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_6;
    case LANGUAGE_FEATURE_INPUT_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_7;
    case LANGUAGE_FEATURE_INPUT_BLOCK_NAME:
      goto switchD_00a8617c_caseD_8;
    case LANGUAGE_FEATURE_OUTPUT:
      goto switchD_00a8617c_caseD_9;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_a;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_b;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME:
      goto switchD_00a8617c_caseD_c;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_d;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_e;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_NAME:
      goto switchD_00a8617c_caseD_f;
    case LANGUAGE_FEATURE_SUBROUTINE_FUNCTION_NAME:
      goto switchD_00a8617c_caseD_14;
    case LANGUAGE_FEATURE_SUBROUTINE_TYPE:
      goto switchD_00a8617c_caseD_15;
    case LANGUAGE_FEATURE_SUBROUTINE_UNIFORM:
      goto switchD_00a8617c_caseD_16;
    case LANGUAGE_FEATURE_UNIFORM:
      goto switchD_00a8617c_caseD_17;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_18;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_19;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME:
      goto switchD_00a8617c_caseD_1a;
    case LANGUAGE_FEATURE_VARYING:
      goto switchD_00a8617c_caseD_1c;
    }
    break;
  case LANGUAGE_FEATURE_ATTRIBUTE:
switchD_00a8617c_caseD_1:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"attribute vec4 ",0xf);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    switch(language_feature) {
    case LANGUAGE_FEATURE_CONSTANT:
      goto switchD_00a8617c_caseD_2;
    case LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME:
      goto switchD_00a8617c_caseD_3;
    case LANGUAGE_FEATURE_FUNCTION_NAME:
      goto switchD_00a8617c_caseD_4;
    case LANGUAGE_FEATURE_INPUT:
      goto switchD_00a8617c_caseD_5;
    case LANGUAGE_FEATURE_INPUT_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_6;
    case LANGUAGE_FEATURE_INPUT_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_7;
    case LANGUAGE_FEATURE_INPUT_BLOCK_NAME:
      goto switchD_00a8617c_caseD_8;
    case LANGUAGE_FEATURE_OUTPUT:
      goto switchD_00a8617c_caseD_9;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_a;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_b;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME:
      goto switchD_00a8617c_caseD_c;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_d;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_e;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_NAME:
      goto switchD_00a8617c_caseD_f;
    case LANGUAGE_FEATURE_SUBROUTINE_FUNCTION_NAME:
      goto switchD_00a8617c_caseD_14;
    case LANGUAGE_FEATURE_SUBROUTINE_TYPE:
      goto switchD_00a8617c_caseD_15;
    case LANGUAGE_FEATURE_SUBROUTINE_UNIFORM:
      goto switchD_00a8617c_caseD_16;
    case LANGUAGE_FEATURE_UNIFORM:
      goto switchD_00a8617c_caseD_17;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_18;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_19;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME:
      goto switchD_00a8617c_caseD_1a;
    case LANGUAGE_FEATURE_VARYING:
      goto switchD_00a8617c_caseD_1c;
    }
    break;
  case LANGUAGE_FEATURE_CONSTANT:
switchD_00a8617c_caseD_2:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"const vec4 ",0xb);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," = vec4(2.0, 3.0, 4.0, 5.0);\n",0x1d);
    switch(language_feature) {
    case LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME:
      goto switchD_00a8617c_caseD_3;
    case LANGUAGE_FEATURE_FUNCTION_NAME:
      goto switchD_00a8617c_caseD_4;
    case LANGUAGE_FEATURE_INPUT:
      goto switchD_00a8617c_caseD_5;
    case LANGUAGE_FEATURE_INPUT_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_6;
    case LANGUAGE_FEATURE_INPUT_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_7;
    case LANGUAGE_FEATURE_INPUT_BLOCK_NAME:
      goto switchD_00a8617c_caseD_8;
    case LANGUAGE_FEATURE_OUTPUT:
      goto switchD_00a8617c_caseD_9;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_a;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_b;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME:
      goto switchD_00a8617c_caseD_c;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_d;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_e;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_NAME:
      goto switchD_00a8617c_caseD_f;
    case LANGUAGE_FEATURE_SUBROUTINE_FUNCTION_NAME:
      goto switchD_00a8617c_caseD_14;
    case LANGUAGE_FEATURE_SUBROUTINE_TYPE:
      goto switchD_00a8617c_caseD_15;
    case LANGUAGE_FEATURE_SUBROUTINE_UNIFORM:
      goto switchD_00a8617c_caseD_16;
    case LANGUAGE_FEATURE_UNIFORM:
      goto switchD_00a8617c_caseD_17;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_18;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_19;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME:
      goto switchD_00a8617c_caseD_1a;
    case LANGUAGE_FEATURE_VARYING:
      goto switchD_00a8617c_caseD_1c;
    }
    break;
  case LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME:
switchD_00a8617c_caseD_3:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"void test(in vec4 ",0x12);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")\n{\n}\n",6);
    switch(language_feature) {
    case LANGUAGE_FEATURE_FUNCTION_NAME:
      goto switchD_00a8617c_caseD_4;
    case LANGUAGE_FEATURE_INPUT:
      goto switchD_00a8617c_caseD_5;
    case LANGUAGE_FEATURE_INPUT_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_6;
    case LANGUAGE_FEATURE_INPUT_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_7;
    case LANGUAGE_FEATURE_INPUT_BLOCK_NAME:
      goto switchD_00a8617c_caseD_8;
    case LANGUAGE_FEATURE_OUTPUT:
      goto switchD_00a8617c_caseD_9;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_a;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_b;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME:
      goto switchD_00a8617c_caseD_c;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_d;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_e;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_NAME:
      goto switchD_00a8617c_caseD_f;
    case LANGUAGE_FEATURE_SUBROUTINE_FUNCTION_NAME:
      goto switchD_00a8617c_caseD_14;
    case LANGUAGE_FEATURE_SUBROUTINE_TYPE:
      goto switchD_00a8617c_caseD_15;
    case LANGUAGE_FEATURE_SUBROUTINE_UNIFORM:
      goto switchD_00a8617c_caseD_16;
    case LANGUAGE_FEATURE_UNIFORM:
      goto switchD_00a8617c_caseD_17;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_18;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_19;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME:
      goto switchD_00a8617c_caseD_1a;
    case LANGUAGE_FEATURE_VARYING:
      goto switchD_00a8617c_caseD_1c;
    }
    break;
  case LANGUAGE_FEATURE_FUNCTION_NAME:
switchD_00a8617c_caseD_4:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void ",5);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"(in vec4 test)\n{\n}\n",0x13);
    switch(language_feature) {
    case LANGUAGE_FEATURE_INPUT:
      goto switchD_00a8617c_caseD_5;
    case LANGUAGE_FEATURE_INPUT_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_6;
    case LANGUAGE_FEATURE_INPUT_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_7;
    case LANGUAGE_FEATURE_INPUT_BLOCK_NAME:
      goto switchD_00a8617c_caseD_8;
    case LANGUAGE_FEATURE_OUTPUT:
      goto switchD_00a8617c_caseD_9;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_a;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_b;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME:
      goto switchD_00a8617c_caseD_c;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_d;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_e;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_NAME:
      goto switchD_00a8617c_caseD_f;
    case LANGUAGE_FEATURE_SUBROUTINE_FUNCTION_NAME:
      goto switchD_00a8617c_caseD_14;
    case LANGUAGE_FEATURE_SUBROUTINE_TYPE:
      goto switchD_00a8617c_caseD_15;
    case LANGUAGE_FEATURE_SUBROUTINE_UNIFORM:
      goto switchD_00a8617c_caseD_16;
    case LANGUAGE_FEATURE_UNIFORM:
      goto switchD_00a8617c_caseD_17;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_18;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_19;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME:
      goto switchD_00a8617c_caseD_1a;
    case LANGUAGE_FEATURE_VARYING:
      goto switchD_00a8617c_caseD_1c;
    }
    break;
  case LANGUAGE_FEATURE_INPUT:
switchD_00a8617c_caseD_5:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in vec4 ",8);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    if (shader_type - LANGUAGE_FEATURE_CONSTANT < 3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[]",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    switch(language_feature) {
    case LANGUAGE_FEATURE_INPUT_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_6;
    case LANGUAGE_FEATURE_INPUT_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_7;
    case LANGUAGE_FEATURE_INPUT_BLOCK_NAME:
      goto switchD_00a8617c_caseD_8;
    case LANGUAGE_FEATURE_OUTPUT:
      goto switchD_00a8617c_caseD_9;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_a;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_b;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME:
      goto switchD_00a8617c_caseD_c;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_d;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_e;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_NAME:
      goto switchD_00a8617c_caseD_f;
    case LANGUAGE_FEATURE_SUBROUTINE_FUNCTION_NAME:
      goto switchD_00a8617c_caseD_14;
    case LANGUAGE_FEATURE_SUBROUTINE_TYPE:
      goto switchD_00a8617c_caseD_15;
    case LANGUAGE_FEATURE_SUBROUTINE_UNIFORM:
      goto switchD_00a8617c_caseD_16;
    case LANGUAGE_FEATURE_UNIFORM:
      goto switchD_00a8617c_caseD_17;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_18;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_19;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME:
      goto switchD_00a8617c_caseD_1a;
    case LANGUAGE_FEATURE_VARYING:
      goto switchD_00a8617c_caseD_1c;
    }
    break;
  case LANGUAGE_FEATURE_INPUT_BLOCK_INSTANCE_NAME:
switchD_00a8617c_caseD_6:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"in testBlock\n{\n    vec4 test;\n} ",0x20);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    if (shader_type - LANGUAGE_FEATURE_CONSTANT < 3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[]",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    switch(language_feature) {
    case LANGUAGE_FEATURE_INPUT_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_7;
    case LANGUAGE_FEATURE_INPUT_BLOCK_NAME:
      goto switchD_00a8617c_caseD_8;
    case LANGUAGE_FEATURE_OUTPUT:
      goto switchD_00a8617c_caseD_9;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_a;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_b;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME:
      goto switchD_00a8617c_caseD_c;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_d;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_e;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_NAME:
      goto switchD_00a8617c_caseD_f;
    case LANGUAGE_FEATURE_SUBROUTINE_FUNCTION_NAME:
      goto switchD_00a8617c_caseD_14;
    case LANGUAGE_FEATURE_SUBROUTINE_TYPE:
      goto switchD_00a8617c_caseD_15;
    case LANGUAGE_FEATURE_SUBROUTINE_UNIFORM:
      goto switchD_00a8617c_caseD_16;
    case LANGUAGE_FEATURE_UNIFORM:
      goto switchD_00a8617c_caseD_17;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_18;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_19;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME:
      goto switchD_00a8617c_caseD_1a;
    case LANGUAGE_FEATURE_VARYING:
      goto switchD_00a8617c_caseD_1c;
    }
    break;
  case LANGUAGE_FEATURE_INPUT_BLOCK_MEMBER_NAME:
switchD_00a8617c_caseD_7:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"in testBlock\n{\n    vec4 ",0x18);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,";\n} testBlockInstance",0x15);
    if (shader_type - LANGUAGE_FEATURE_CONSTANT < 3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[]",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    switch(language_feature) {
    case LANGUAGE_FEATURE_INPUT_BLOCK_NAME:
      goto switchD_00a8617c_caseD_8;
    case LANGUAGE_FEATURE_OUTPUT:
      goto switchD_00a8617c_caseD_9;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_a;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_b;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME:
      goto switchD_00a8617c_caseD_c;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_d;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_e;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_NAME:
      goto switchD_00a8617c_caseD_f;
    case LANGUAGE_FEATURE_SUBROUTINE_FUNCTION_NAME:
      goto switchD_00a8617c_caseD_14;
    case LANGUAGE_FEATURE_SUBROUTINE_TYPE:
      goto switchD_00a8617c_caseD_15;
    case LANGUAGE_FEATURE_SUBROUTINE_UNIFORM:
      goto switchD_00a8617c_caseD_16;
    case LANGUAGE_FEATURE_UNIFORM:
      goto switchD_00a8617c_caseD_17;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_18;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_19;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME:
      goto switchD_00a8617c_caseD_1a;
    case LANGUAGE_FEATURE_VARYING:
      goto switchD_00a8617c_caseD_1c;
    }
    break;
  case LANGUAGE_FEATURE_INPUT_BLOCK_NAME:
switchD_00a8617c_caseD_8:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\n{\n    vec4 test;\n} testBlockInstance",0x25);
    if (shader_type - LANGUAGE_FEATURE_CONSTANT < 3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[]",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    switch(language_feature) {
    case LANGUAGE_FEATURE_OUTPUT:
      goto switchD_00a8617c_caseD_9;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_a;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_b;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME:
      goto switchD_00a8617c_caseD_c;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_d;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_e;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_NAME:
      goto switchD_00a8617c_caseD_f;
    case LANGUAGE_FEATURE_SUBROUTINE_FUNCTION_NAME:
      goto switchD_00a8617c_caseD_14;
    case LANGUAGE_FEATURE_SUBROUTINE_TYPE:
      goto switchD_00a8617c_caseD_15;
    case LANGUAGE_FEATURE_SUBROUTINE_UNIFORM:
      goto switchD_00a8617c_caseD_16;
    case LANGUAGE_FEATURE_UNIFORM:
      goto switchD_00a8617c_caseD_17;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_18;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_19;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME:
      goto switchD_00a8617c_caseD_1a;
    case LANGUAGE_FEATURE_VARYING:
      goto switchD_00a8617c_caseD_1c;
    }
    break;
  case LANGUAGE_FEATURE_OUTPUT:
switchD_00a8617c_caseD_9:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"out vec4 ",9);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    if (shader_type == LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[]",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    switch(language_feature) {
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_a;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_b;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME:
      goto switchD_00a8617c_caseD_c;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_d;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_e;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_NAME:
      goto switchD_00a8617c_caseD_f;
    case LANGUAGE_FEATURE_SUBROUTINE_FUNCTION_NAME:
      goto switchD_00a8617c_caseD_14;
    case LANGUAGE_FEATURE_SUBROUTINE_TYPE:
      goto switchD_00a8617c_caseD_15;
    case LANGUAGE_FEATURE_SUBROUTINE_UNIFORM:
      goto switchD_00a8617c_caseD_16;
    case LANGUAGE_FEATURE_UNIFORM:
      goto switchD_00a8617c_caseD_17;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_18;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_19;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME:
      goto switchD_00a8617c_caseD_1a;
    case LANGUAGE_FEATURE_VARYING:
      goto switchD_00a8617c_caseD_1c;
    }
    break;
  case LANGUAGE_FEATURE_OUTPUT_BLOCK_INSTANCE_NAME:
switchD_00a8617c_caseD_a:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"out testBlock\n{\n    vec4 test;\n} ",0x21);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    if (shader_type == LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[]",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    switch(language_feature) {
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_b;
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME:
      goto switchD_00a8617c_caseD_c;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_d;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_e;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_NAME:
      goto switchD_00a8617c_caseD_f;
    case LANGUAGE_FEATURE_SUBROUTINE_FUNCTION_NAME:
      goto switchD_00a8617c_caseD_14;
    case LANGUAGE_FEATURE_SUBROUTINE_TYPE:
      goto switchD_00a8617c_caseD_15;
    case LANGUAGE_FEATURE_SUBROUTINE_UNIFORM:
      goto switchD_00a8617c_caseD_16;
    case LANGUAGE_FEATURE_UNIFORM:
      goto switchD_00a8617c_caseD_17;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_18;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_19;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME:
      goto switchD_00a8617c_caseD_1a;
    case LANGUAGE_FEATURE_VARYING:
      goto switchD_00a8617c_caseD_1c;
    }
    break;
  case LANGUAGE_FEATURE_OUTPUT_BLOCK_MEMBER_NAME:
switchD_00a8617c_caseD_b:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"out testBlock\n{\n    vec4 ",0x19);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,";\n} testBlockInstance",0x15);
    if (shader_type == LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[]",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    switch(language_feature) {
    case LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME:
      goto switchD_00a8617c_caseD_c;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_d;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_e;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_NAME:
      goto switchD_00a8617c_caseD_f;
    case LANGUAGE_FEATURE_SUBROUTINE_FUNCTION_NAME:
      goto switchD_00a8617c_caseD_14;
    case LANGUAGE_FEATURE_SUBROUTINE_TYPE:
      goto switchD_00a8617c_caseD_15;
    case LANGUAGE_FEATURE_SUBROUTINE_UNIFORM:
      goto switchD_00a8617c_caseD_16;
    case LANGUAGE_FEATURE_UNIFORM:
      goto switchD_00a8617c_caseD_17;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_18;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_19;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME:
      goto switchD_00a8617c_caseD_1a;
    case LANGUAGE_FEATURE_VARYING:
      goto switchD_00a8617c_caseD_1c;
    }
    break;
  case LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME:
switchD_00a8617c_caseD_c:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"out ",4);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\n{\n    vec4 test;\n} testBlockInstance",0x25);
    if (shader_type == LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[]",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    switch(language_feature) {
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_d;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_e;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_NAME:
      goto switchD_00a8617c_caseD_f;
    case LANGUAGE_FEATURE_SUBROUTINE_FUNCTION_NAME:
      goto switchD_00a8617c_caseD_14;
    case LANGUAGE_FEATURE_SUBROUTINE_TYPE:
      goto switchD_00a8617c_caseD_15;
    case LANGUAGE_FEATURE_SUBROUTINE_UNIFORM:
      goto switchD_00a8617c_caseD_16;
    case LANGUAGE_FEATURE_UNIFORM:
      goto switchD_00a8617c_caseD_17;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_18;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_19;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME:
      goto switchD_00a8617c_caseD_1a;
    case LANGUAGE_FEATURE_VARYING:
      goto switchD_00a8617c_caseD_1c;
    }
    break;
  case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_INSTANCE_NAME:
switchD_00a8617c_caseD_d:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"buffer testBlock\n{\n    vec4 test;\n} ",0x24);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    switch(language_feature) {
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_e;
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_NAME:
      goto switchD_00a8617c_caseD_f;
    case LANGUAGE_FEATURE_SUBROUTINE_FUNCTION_NAME:
      goto switchD_00a8617c_caseD_14;
    case LANGUAGE_FEATURE_SUBROUTINE_TYPE:
      goto switchD_00a8617c_caseD_15;
    case LANGUAGE_FEATURE_SUBROUTINE_UNIFORM:
      goto switchD_00a8617c_caseD_16;
    case LANGUAGE_FEATURE_UNIFORM:
      goto switchD_00a8617c_caseD_17;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_18;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_19;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME:
      goto switchD_00a8617c_caseD_1a;
    case LANGUAGE_FEATURE_VARYING:
      goto switchD_00a8617c_caseD_1c;
    }
    break;
  case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_MEMBER_NAME:
switchD_00a8617c_caseD_e:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"buffer testBlock\n{\n    vec4 ",0x1c);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n};\n",5);
    switch(language_feature) {
    case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_NAME:
      goto switchD_00a8617c_caseD_f;
    case LANGUAGE_FEATURE_SUBROUTINE_FUNCTION_NAME:
      goto switchD_00a8617c_caseD_14;
    case LANGUAGE_FEATURE_SUBROUTINE_TYPE:
      goto switchD_00a8617c_caseD_15;
    case LANGUAGE_FEATURE_SUBROUTINE_UNIFORM:
      goto switchD_00a8617c_caseD_16;
    case LANGUAGE_FEATURE_UNIFORM:
      goto switchD_00a8617c_caseD_17;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_18;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_19;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME:
      goto switchD_00a8617c_caseD_1a;
    case LANGUAGE_FEATURE_VARYING:
      goto switchD_00a8617c_caseD_1c;
    }
    break;
  case LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_NAME:
switchD_00a8617c_caseD_f:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"buffer ",7);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\n{\n    vec4 test;\n};\n",0x15);
    switch(language_feature) {
    case LANGUAGE_FEATURE_SUBROUTINE_FUNCTION_NAME:
      goto switchD_00a8617c_caseD_14;
    case LANGUAGE_FEATURE_SUBROUTINE_TYPE:
      goto switchD_00a8617c_caseD_15;
    case LANGUAGE_FEATURE_SUBROUTINE_UNIFORM:
      goto switchD_00a8617c_caseD_16;
    case LANGUAGE_FEATURE_UNIFORM:
      goto switchD_00a8617c_caseD_17;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_18;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_19;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME:
      goto switchD_00a8617c_caseD_1a;
    case LANGUAGE_FEATURE_VARYING:
      goto switchD_00a8617c_caseD_1c;
    }
    break;
  case LANGUAGE_FEATURE_SUBROUTINE_FUNCTION_NAME:
switchD_00a8617c_caseD_14:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"subroutine void exampleSubroutine(inout vec4 ",0x2d);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,");\n\nsubroutine (exampleSubroutine) void invert(inout vec4 ",
               0x3a);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")\n{\n    ",8);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               " += vec4(0.0, 1.0, 2.0, 3.0);\n}\n\nsubroutine uniform exampleSubroutine testSubroutine;\n"
               ,0x56);
    switch(language_feature) {
    case LANGUAGE_FEATURE_SUBROUTINE_TYPE:
      goto switchD_00a8617c_caseD_15;
    case LANGUAGE_FEATURE_SUBROUTINE_UNIFORM:
      goto switchD_00a8617c_caseD_16;
    case LANGUAGE_FEATURE_UNIFORM:
      goto switchD_00a8617c_caseD_17;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_18;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_19;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME:
      goto switchD_00a8617c_caseD_1a;
    case LANGUAGE_FEATURE_VARYING:
      goto switchD_00a8617c_caseD_1c;
    }
    break;
  case LANGUAGE_FEATURE_SUBROUTINE_TYPE:
switchD_00a8617c_caseD_15:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"subroutine void ",0x10)
    ;
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"(inout vec4 arg);\n\nsubroutine (",0x1f);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               ") void invert(inout vec4 arg)\n{\n    arg += vec4(0.0, 1.0, 2.0, 3.0);\n}\n\nsubroutine uniform "
               ,0x5b);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," testSubroutine;\n",0x11);
    switch(language_feature) {
    case LANGUAGE_FEATURE_SUBROUTINE_UNIFORM:
      goto switchD_00a8617c_caseD_16;
    case LANGUAGE_FEATURE_UNIFORM:
      goto switchD_00a8617c_caseD_17;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_18;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_19;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME:
      goto switchD_00a8617c_caseD_1a;
    case LANGUAGE_FEATURE_VARYING:
      goto switchD_00a8617c_caseD_1c;
    }
    break;
  case LANGUAGE_FEATURE_SUBROUTINE_UNIFORM:
switchD_00a8617c_caseD_16:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "subroutine void exampleSubroutine(inout vec4 arg);\n\nsubroutine (exampleSubroutine) void invert(inout vec4 arg)\n{\n    arg += vec4(0.0, 1.0, 2.0, 3.0);\n}\n\nsubroutine uniform exampleSubroutine "
               ,0xbe);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    switch(language_feature) {
    case LANGUAGE_FEATURE_UNIFORM:
      goto switchD_00a8617c_caseD_17;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_18;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_19;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME:
      goto switchD_00a8617c_caseD_1a;
    case LANGUAGE_FEATURE_VARYING:
      goto switchD_00a8617c_caseD_1c;
    }
    break;
  case LANGUAGE_FEATURE_UNIFORM:
switchD_00a8617c_caseD_17:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"uniform sampler2D ",0x12);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    switch(language_feature) {
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME:
      goto switchD_00a8617c_caseD_18;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME:
      goto switchD_00a8617c_caseD_19;
    case LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME:
      goto switchD_00a8617c_caseD_1a;
    case LANGUAGE_FEATURE_VARYING:
      goto switchD_00a8617c_caseD_1c;
    }
    break;
  case LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME:
switchD_00a8617c_caseD_18:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"uniform testBlock\n{\n    vec4 test;\n} ",0x25);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    if (language_feature == LANGUAGE_FEATURE_VARYING) goto switchD_00a8617c_caseD_1c;
    if (language_feature == LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME) goto switchD_00a8617c_caseD_1a;
    if (language_feature == LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME)
    goto switchD_00a8617c_caseD_19;
    break;
  case LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME:
switchD_00a8617c_caseD_19:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"uniform testBlock\n{\n    vec4 ",0x1d);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n};\n",5);
    if (language_feature == LANGUAGE_FEATURE_VARYING) goto switchD_00a8617c_caseD_1c;
    if (language_feature == LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME) goto switchD_00a8617c_caseD_1a;
    break;
  case LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME:
switchD_00a8617c_caseD_1a:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"uniform ",8);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\n{\n    vec4 test;\n};\n",0x15);
    if (language_feature == LANGUAGE_FEATURE_VARYING) goto switchD_00a8617c_caseD_1c;
    break;
  case LANGUAGE_FEATURE_VARYING:
switchD_00a8617c_caseD_1c:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"varying vec4 ",0xd);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main()\n{\n",0xe);
  switch(language_feature) {
  case LANGUAGE_FEATURE_SHARED_VARIABLE:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"shared vec4 ",0xc);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    if ((int)language_feature < 0x13) {
      if (language_feature != LANGUAGE_FEATURE_STRUCTURE_MEMBER) {
        if (language_feature != LANGUAGE_FEATURE_STRUCTURE_INSTANCE_NAME)
        goto switchD_00a86f5a_caseD_14;
        goto switchD_00a86f5a_caseD_12;
      }
      goto switchD_00a86f5a_caseD_11;
    }
    if (language_feature == LANGUAGE_FEATURE_STRUCTURE_NAME) goto switchD_00a86f5a_caseD_13;
    goto LAB_00a8713f;
  case LANGUAGE_FEATURE_STRUCTURE_MEMBER:
switchD_00a86f5a_caseD_11:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"struct\n{\n    vec4 ",0x12);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,";\n} testInstance;\n",0x12);
    if (language_feature != LANGUAGE_FEATURE_VARIABLE) {
      if (language_feature != LANGUAGE_FEATURE_STRUCTURE_NAME) goto switchD_00a86f5a_caseD_14;
      goto switchD_00a86f5a_caseD_13;
    }
    break;
  case LANGUAGE_FEATURE_STRUCTURE_INSTANCE_NAME:
switchD_00a86f5a_caseD_12:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"struct\n{\n    vec4 test;\n} ",0x1a);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    if (language_feature != LANGUAGE_FEATURE_VARIABLE) {
      if (language_feature != LANGUAGE_FEATURE_STRUCTURE_NAME) {
        if (language_feature != LANGUAGE_FEATURE_STRUCTURE_MEMBER) goto switchD_00a86f5a_caseD_14;
        goto switchD_00a86f5a_caseD_11;
      }
      goto switchD_00a86f5a_caseD_13;
    }
    break;
  case LANGUAGE_FEATURE_STRUCTURE_NAME:
switchD_00a86f5a_caseD_13:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"struct ",7);
    if (invalid_name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(invalid_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"{\n    vec4 test;\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"};\n",3);
LAB_00a8713f:
    if (language_feature != LANGUAGE_FEATURE_VARIABLE) goto switchD_00a86f5a_caseD_14;
    break;
  default:
    goto switchD_00a86f5a_caseD_14;
  case LANGUAGE_FEATURE_VARIABLE:
    break;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"vec4 ",5);
  if (invalid_name == (char *)0x0) {
    std::ios::clear(iVar1 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar3 = strlen(invalid_name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,invalid_name,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
switchD_00a86f5a_caseD_14:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string ReservedNamesTest::getShaderBody(_shader_type shader_type, _language_feature language_feature,
											 const char* invalid_name) const
{
	std::stringstream	  body_sstream;
	const glu::ContextType context_type = m_context.getRenderContext().getType();

	/* Preamble: shader language version */
	body_sstream << "#version ";

	glu::ApiType apiType = context_type.getAPI();
	if (apiType == glu::ApiType::core(3, 1))
		body_sstream << "140";
	else if (apiType == glu::ApiType::core(3, 2))
		body_sstream << "150";
	else if (apiType == glu::ApiType::core(3, 3))
		body_sstream << "330";
	else if (apiType == glu::ApiType::core(4, 0))
		body_sstream << "400";
	else if (apiType == glu::ApiType::core(4, 1))
		body_sstream << "410";
	else if (apiType == glu::ApiType::core(4, 2))
		body_sstream << "420";
	else if (apiType == glu::ApiType::core(4, 3))
		body_sstream << "430";
	else if (apiType == glu::ApiType::core(4, 4))
		body_sstream << "440";
	else if (apiType == glu::ApiType::core(4, 5))
		body_sstream << "450";
	else
	{
		TCU_FAIL("Unsupported GL context version - please implement");
	}

	body_sstream << "\n\n";

	/* Preamble: layout qualifiers - required for CS, TC and TE shader stages */
	if (shader_type == SHADER_TYPE_COMPUTE)
	{
		body_sstream << "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n";
	}
	else if (shader_type == SHADER_TYPE_TESS_CONTROL)
	{
		body_sstream << "layout(vertices = 3) out;\n";
	}
	else if (shader_type == SHADER_TYPE_TESS_EVALUATION)
	{
		body_sstream << "layout(triangles) in;\n";
	}

	body_sstream << "\n\n";

	/* Language feature: insert incorrectly named atomic counter declaration if needed */
	if (language_feature == LANGUAGE_FEATURE_ATOMIC_COUNTER)
	{
		body_sstream << "layout(binding = 0, offset = 0) uniform atomic_uint " << invalid_name << ";\n";
	}

	/* Language feature: insert incorrectly named attribute declaration if needed */
	if (language_feature == LANGUAGE_FEATURE_ATTRIBUTE)
	{
		body_sstream << "attribute vec4 " << invalid_name << ";\n";
	}

	/* Language feature: insert incorrectly name constant declaration if needed */
	if (language_feature == LANGUAGE_FEATURE_CONSTANT)
	{
		body_sstream << "const vec4 " << invalid_name << " = vec4(2.0, 3.0, 4.0, 5.0);\n";
	}

	/* Language feature: insert a function with incorrectly named argument if needed */
	if (language_feature == LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME)
	{
		body_sstream << "void test(in vec4 " << invalid_name << ")\n"
																"{\n"
																"}\n";
	}

	/* Language feature: insert incorrectly named function if needed */
	if (language_feature == LANGUAGE_FEATURE_FUNCTION_NAME)
	{
		body_sstream << "void " << invalid_name << "(in vec4 test)\n"
												   "{\n"
												   "}\n";
	}

	/* Language feature: insert incorrectly named input variable if needed */
	if (language_feature == LANGUAGE_FEATURE_INPUT)
	{
		body_sstream << "in vec4 " << invalid_name;

		if (shader_type == SHADER_TYPE_GEOMETRY || shader_type == SHADER_TYPE_TESS_CONTROL ||
			shader_type == SHADER_TYPE_TESS_EVALUATION)
		{
			body_sstream << "[]";
		}

		body_sstream << ";\n";
	}

	/* Language feature: insert declaration of an incorrectly named input block instance if needed */
	if (language_feature == LANGUAGE_FEATURE_INPUT_BLOCK_INSTANCE_NAME)
	{
		body_sstream << "in testBlock\n"
						"{\n"
						"    vec4 test;\n"
						"} "
					 << invalid_name;

		if (shader_type == SHADER_TYPE_GEOMETRY || shader_type == SHADER_TYPE_TESS_CONTROL ||
			shader_type == SHADER_TYPE_TESS_EVALUATION)
		{
			body_sstream << "[]";
		}

		body_sstream << ";\n";
	}

	/* Language feature: insert declaration of an input block holding an incorrectly named member variable */
	if (language_feature == LANGUAGE_FEATURE_INPUT_BLOCK_MEMBER_NAME)
	{
		body_sstream << "in testBlock\n"
						"{\n"
						"    vec4 "
					 << invalid_name << ";\n"
										"} testBlockInstance";

		if (shader_type == SHADER_TYPE_GEOMETRY || shader_type == SHADER_TYPE_TESS_CONTROL ||
			shader_type == SHADER_TYPE_TESS_EVALUATION)
		{
			body_sstream << "[]";
		}

		body_sstream << ";\n";
	}

	/* Language feature: insert declaration of an incorrectly named input block */
	if (language_feature == LANGUAGE_FEATURE_INPUT_BLOCK_NAME)
	{
		body_sstream << "in " << invalid_name << "\n"
												 "{\n"
												 "    vec4 test;\n"
												 "} testBlockInstance";

		if (shader_type == SHADER_TYPE_GEOMETRY || shader_type == SHADER_TYPE_TESS_CONTROL ||
			shader_type == SHADER_TYPE_TESS_EVALUATION)
		{
			body_sstream << "[]";
		}

		body_sstream << ";\n";
	}

	/* Language feature: insert incorrectly named output variable if needed */
	if (language_feature == LANGUAGE_FEATURE_OUTPUT)
	{
		body_sstream << "out vec4 " << invalid_name;

		if (shader_type == SHADER_TYPE_TESS_CONTROL)
		{
			body_sstream << "[]";
		}

		body_sstream << ";\n";
	}

	/* Language feature: insert declaration of an incorrectly named output block instance if needed */
	if (language_feature == LANGUAGE_FEATURE_OUTPUT_BLOCK_INSTANCE_NAME)
	{
		body_sstream << "out testBlock\n"
						"{\n"
						"    vec4 test;\n"
						"} "
					 << invalid_name;

		if (shader_type == SHADER_TYPE_TESS_CONTROL)
		{
			body_sstream << "[]";
		}

		body_sstream << ";\n";
	}

	/* Language feature: insert declaration of an output block holding an incorrectly named member variable */
	if (language_feature == LANGUAGE_FEATURE_OUTPUT_BLOCK_MEMBER_NAME)
	{
		body_sstream << "out testBlock\n"
						"{\n"
						"    vec4 "
					 << invalid_name << ";\n"
										"} testBlockInstance";

		if (shader_type == SHADER_TYPE_TESS_CONTROL)
		{
			body_sstream << "[]";
		}

		body_sstream << ";\n";
	}

	/* Language feature: insert declaration of an incorrectly named output block */
	if (language_feature == LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME)
	{
		body_sstream << "out " << invalid_name << "\n"
												  "{\n"
												  "    vec4 test;\n"
												  "} testBlockInstance";

		if (shader_type == SHADER_TYPE_TESS_CONTROL)
		{
			body_sstream << "[]";
		}

		body_sstream << ";\n";
	}

	/* Language feature: insert declaration of an incorrectly named shader storage block instance if needed */
	if (language_feature == LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_INSTANCE_NAME)
	{
		body_sstream << "buffer testBlock\n"
						"{\n"
						"    vec4 test;\n"
						"} "
					 << invalid_name << ";\n";
	}

	/* Language feature: insert declaration of a shader storage block holding an incorrectly named member variable */
	if (language_feature == LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_MEMBER_NAME)
	{
		body_sstream << "buffer testBlock\n"
						"{\n"
						"    vec4 "
					 << invalid_name << ";\n"
										"};\n";
	}

	/* Language feature: insert declaration of an incorrectly named shader storage block */
	if (language_feature == LANGUAGE_FEATURE_SHADER_STORAGE_BLOCK_NAME)
	{
		body_sstream << "buffer " << invalid_name << "\n"
													 "{\n"
													 "    vec4 test;\n"
													 "};\n";
	}

	/* Language feature: insert declaration of a subroutine function with invalid name */
	if (language_feature == LANGUAGE_FEATURE_SUBROUTINE_FUNCTION_NAME)
	{
		body_sstream << "subroutine void exampleSubroutine(inout vec4 " << invalid_name
					 << ");\n"
						"\n"
						"subroutine (exampleSubroutine) void invert(inout vec4 "
					 << invalid_name << ")\n"
										"{\n"
										"    "
					 << invalid_name << " += vec4(0.0, 1.0, 2.0, 3.0);\n"
										"}\n"
										"\n"
										"subroutine uniform exampleSubroutine testSubroutine;\n";
	}

	/* Language feature: insert declaration of a subroutine of incorrectly named type */
	if (language_feature == LANGUAGE_FEATURE_SUBROUTINE_TYPE)
	{
		body_sstream << "subroutine void " << invalid_name << "(inout vec4 arg);\n"
															  "\n"
															  "subroutine ("
					 << invalid_name << ") void invert(inout vec4 arg)\n"
										"{\n"
										"    arg += vec4(0.0, 1.0, 2.0, 3.0);\n"
										"}\n"
										"\n"
										"subroutine uniform "
					 << invalid_name << " testSubroutine;\n";
	}

	/* Language feature: insert declaration of a subroutine, followed by a declaration of
	 *                   an incorrectly named subroutine uniform.
	 */
	if (language_feature == LANGUAGE_FEATURE_SUBROUTINE_UNIFORM)
	{
		body_sstream << "subroutine void exampleSubroutine(inout vec4 arg);\n"
						"\n"
						"subroutine (exampleSubroutine) void invert(inout vec4 arg)\n"
						"{\n"
						"    arg += vec4(0.0, 1.0, 2.0, 3.0);\n"
						"}\n"
						"\n"
						"subroutine uniform exampleSubroutine "
					 << invalid_name << ";\n";
	}

	/* Language feature: insert declaration of an incorrectly named uniform. */
	if (language_feature == LANGUAGE_FEATURE_UNIFORM)
	{
		body_sstream << "uniform sampler2D " << invalid_name << ";\n";
	}

	/* Language feature: insert declaration of an incorrectly named uniform block instance if needed */
	if (language_feature == LANGUAGE_FEATURE_UNIFORM_BLOCK_INSTANCE_NAME)
	{
		body_sstream << "uniform testBlock\n"
						"{\n"
						"    vec4 test;\n"
						"} "
					 << invalid_name << ";\n";
	}

	/* Language feature: insert declaration of an uniform block holding an incorrectly named member variable */
	if (language_feature == LANGUAGE_FEATURE_UNIFORM_BLOCK_MEMBER_NAME)
	{
		body_sstream << "uniform testBlock\n"
						"{\n"
						"    vec4 "
					 << invalid_name << ";\n"
										"};\n";
	}

	/* Language feature: insert declaration of an incorrectly named uniform block */
	if (language_feature == LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME)
	{
		body_sstream << "uniform " << invalid_name << "\n"
													  "{\n"
													  "    vec4 test;\n"
													  "};\n";
	}

	/* Language feature: insert declaration of an incorrectly named varying */
	if (language_feature == LANGUAGE_FEATURE_VARYING)
	{
		body_sstream << "varying vec4 " << invalid_name << ";\n";
	}

	/* Start implementation of the main entry-point. */
	body_sstream << "void main()\n"
					"{\n";

	/* Language feature: insert declaration of an incorrectly named shared variable. */
	if (language_feature == LANGUAGE_FEATURE_SHARED_VARIABLE)
	{
		body_sstream << "shared vec4 " << invalid_name << ";\n";
	}

	/* Language feature: insert declaration of a structure, whose instance name is incorrect */
	if (language_feature == LANGUAGE_FEATURE_STRUCTURE_INSTANCE_NAME)
	{
		body_sstream << "struct\n"
						"{\n"
						"    vec4 test;\n"
						"} "
					 << invalid_name << ";\n";
	}

	/* Language feature: insert declaration of a structure with one of its member variables being incorrectly named. */
	if (language_feature == LANGUAGE_FEATURE_STRUCTURE_MEMBER)
	{
		body_sstream << "struct\n"
						"{\n"
						"    vec4 "
					 << invalid_name << ";\n"
										"} testInstance;\n";
	}

	/* Language feature: insert declaration of a structure whose name is incorrect */
	if (language_feature == LANGUAGE_FEATURE_STRUCTURE_NAME)
	{
		body_sstream << "struct " << invalid_name << "{\n"
													 "    vec4 test;\n"
					 << "};\n";
	}

	/* Language feature: insert declaration of a variable with incorrect name. */
	if (language_feature == LANGUAGE_FEATURE_VARIABLE)
	{
		body_sstream << "vec4 " << invalid_name << ";\n";
	}

	/* Close the main entry-point implementation */
	body_sstream << "}\n";

	return body_sstream.str();
}